

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

string * SettingToString(string *__return_storage_ptr__,SettingsValue *value,string *strDefault)

{
  long in_FS_OFFSET;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  SettingToString_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&_Stack_48,value);
  std::optional<std::__cxx11::string>::value_or<std::__cxx11::string_const&>
            (__return_storage_ptr__,(optional<std::__cxx11::string> *)&_Stack_48,strDefault);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&_Stack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string SettingToString(const common::SettingsValue& value, const std::string& strDefault)
{
    return SettingToString(value).value_or(strDefault);
}